

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupEncryptFileFilter.cpp
# Opt level: O0

void __thiscall
GroupEncryptFileFilter::doFilter(GroupEncryptFileFilter *this,ifstream *in,ofstream *out)

{
  int iVar1;
  uint uVar2;
  ulong in_RCX;
  undefined8 extraout_RDX;
  char local_21;
  char outChar;
  char inChar;
  ofstream *out_local;
  ifstream *in_local;
  GroupEncryptFileFilter *this_local;
  
  this->charCounter = 0;
  do {
    while( true ) {
      while( true ) {
        iVar1 = std::istream::peek();
        if (iVar1 == -1) {
          return;
        }
        if (this->charCounter < 5) break;
        std::ostream::put((char)out);
        this->charCounter = 0;
      }
      iVar1 = std::istream::peek();
      if (iVar1 != 0x20) break;
LAB_00102536:
      std::istream::get((char *)in);
    }
    iVar1 = std::istream::peek();
    if (iVar1 == 10) goto LAB_00102536;
    std::istream::get((char *)in);
    (*(this->super_FileFilter)._vptr_FileFilter[1])
              (this,(ulong)(uint)(int)local_21,extraout_RDX,CONCAT71((int7)(in_RCX >> 8),local_21));
    std::ostream::put((char)out);
    uVar2 = this->charCounter + 1;
    in_RCX = (ulong)uVar2;
    this->charCounter = uVar2;
  } while( true );
}

Assistant:

void GroupEncryptFileFilter::doFilter(std::ifstream &in, std::ofstream &out)
{
    this->charCounter = 0;

    while((in.peek() != EOF))
    {

        char inChar;
        char outChar;

        if(this->charCounter >= 5)
        {
            out.put(' ');
            this->charCounter = 0;
            continue;
        }
        else if(in.peek() == ' ' || in.peek() == '\n')
        {
            //grab the input and throw it away
            in.get(inChar);
            continue;
        }
        else
        {
            in.get(inChar);
            outChar = transform(inChar);
            out.put(outChar);
            this->charCounter++;
        }
    }
}